

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcopy_to_ucol.c
# Opt level: O0

int zcopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,doublecomplex *dense,
                 GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int_t *piVar6;
  int_t *piVar7;
  int iVar8;
  int_t iVar9;
  double local_c0;
  doublecomplex zero;
  int_t nzumax;
  int_t *xusub;
  int_t *usub;
  doublecomplex *ucol;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int_t mem_error;
  int_t new_next;
  int_t nextu;
  int_t isub;
  int jsupno;
  int irow;
  int fsupc;
  int segsze;
  int kfnz;
  int k;
  int i;
  int ksupno;
  int krep;
  int ksub;
  doublecomplex *dense_local;
  int *perm_r_local;
  int *repfnz_local;
  int *segrep_local;
  int nseg_local;
  int jcol_local;
  
  memset(&local_c0,0,0x10);
  piVar4 = Glu->xsup;
  piVar5 = Glu->supno;
  xlsub = Glu->lsub;
  piVar6 = Glu->xlsub;
  usub = (int_t *)Glu->ucol;
  xusub = Glu->usub;
  piVar7 = Glu->xusub;
  zero.i._4_4_ = Glu->nzumax;
  iVar1 = piVar5[jcol];
  mem_error = piVar7[jcol];
  ksupno = 0;
  segsze = nseg + -1;
  do {
    if (nseg <= ksupno) {
      piVar7[jcol + 1] = mem_error;
      return 0;
    }
    iVar8 = segrep[segsze];
    iVar2 = piVar5[iVar8];
    if ((iVar2 != iVar1) && (iVar3 = repfnz[iVar8], iVar3 != -1)) {
      new_next = (piVar6[piVar4[iVar2]] + iVar3) - piVar4[iVar2];
      iVar8 = (iVar8 - iVar3) + 1;
      while (zero.i._4_4_ < mem_error + iVar8) {
        iVar9 = zLUMemXpand(jcol,mem_error,UCOL,(int_t *)((long)&zero.i + 4),Glu);
        if (iVar9 != 0) {
          return iVar9;
        }
        usub = (int_t *)Glu->ucol;
        iVar9 = zLUMemXpand(jcol,mem_error,USUB,(int_t *)((long)&zero.i + 4),Glu);
        if (iVar9 != 0) {
          return iVar9;
        }
        xusub = Glu->usub;
        xlsub = Glu->lsub;
      }
      for (kfnz = 0; kfnz < iVar8; kfnz = kfnz + 1) {
        iVar2 = xlsub[new_next];
        xusub[mem_error] = perm_r[iVar2];
        *(double *)(usub + (long)mem_error * 4) = dense[iVar2].r;
        *(double *)((long)(usub + (long)mem_error * 4) + 8) = dense[iVar2].i;
        dense[iVar2].r = local_c0;
        dense[iVar2].i = zero.r;
        mem_error = mem_error + 1;
        new_next = new_next + 1;
      }
    }
    ksupno = ksupno + 1;
    segsze = segsze + -1;
  } while( true );
}

Assistant:

int
zcopy_to_ucol(
	      int        jcol,	  /* in */
	      int        nseg,	  /* in */
	      int        *segrep,  /* in */
	      int        *repfnz,  /* in */
	      int        *perm_r,  /* in */
	      doublecomplex     *dense,   /* modified - reset to zero on return */
	      GlobalLU_t *Glu      /* modified */
	      )
{
/* 
 * Gather from SPA dense[*] to global ucol[*].
 */
    int ksub, krep, ksupno;
    int i, k, kfnz, segsze;
    int fsupc, irow, jsupno;
    int_t isub, nextu, new_next, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    doublecomplex    *ucol;
    int_t     *usub, *xusub;
    int_t       nzumax;
    doublecomplex zero = {0.0, 0.0};

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (doublecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;
    
    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

	    	fsupc = xsup[ksupno];
	        isub = xlsub[fsupc] + kfnz - fsupc;
	        segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    mem_error = zLUMemXpand(jcol, nextu, UCOL, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    ucol = (doublecomplex *) Glu->ucol;
		    mem_error = zLUMemXpand(jcol, nextu, USUB, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}
		
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    usub[nextu] = perm_r[irow];
		    ucol[nextu] = dense[irow];
		    dense[irow] = zero;
		    nextu++;
		    isub++;
		} 

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;      /* Close U[*,jcol] */
    return 0;
}